

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

void __thiscall Graph::compute_degree(Graph *this)

{
  pointer pvVar1;
  pointer pvVar2;
  pointer puVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  
  if (this->num_vertices_ != 0) {
    pvVar1 = (this->succ_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = ((long)(this->succ_).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
            -0x5555555555555555;
    pvVar2 = (this->pred_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = ((long)(this->pred_).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
            -0x5555555555555555;
    puVar3 = (this->deg_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = (long)(this->deg_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2;
    lVar8 = 2;
    uVar9 = 0;
    do {
      uVar7 = uVar5;
      if (((uVar5 - uVar9 == 0) || (uVar7 = uVar6, uVar6 - uVar9 == 0)) ||
         (uVar7 = uVar4, uVar4 == uVar9)) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7
                   ,uVar7);
      }
      puVar3[uVar9] =
           (int)((ulong)(*(long *)((long)&(pvVar2->
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          )._M_impl.super__Vector_impl_data + lVar8 * 4) -
                        *(long *)((long)pvVar2 + lVar8 * 4 + -8)) >> 2) +
           (int)((ulong)(*(long *)((long)&(pvVar1->
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          )._M_impl + lVar8 * 4) -
                        *(long *)((long)pvVar1 + lVar8 * 4 + -8)) >> 2);
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 6;
    } while (uVar9 < this->num_vertices_);
  }
  return;
}

Assistant:

void Graph::compute_degree() {
    for (vertex_t i = 0; i < num_vertices_; ++i) {
        deg_.at(i) = (degree_t)succ_.at(i).size() + (degree_t)pred_.at(i).size();
    }
}